

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::StressCollectNow(Recycler *this)

{
  Recycler *this_local;
  
  if ((this->recyclerStress & 1U) == 0) {
    if ((this->recyclerBackgroundStress & 1U) == 0) {
      if ((((this->enableConcurrentMark & 1U) == 0) && ((this->enableConcurrentSweep & 1U) == 0)) ||
         (((this->recyclerConcurrentStress & 1U) == 0 &&
          ((this->recyclerConcurrentRepeatStress & 1U) == 0)))) {
        if ((this->recyclerPartialStress & 1U) == 0) {
          this_local._7_1_ = false;
        }
        else {
          CollectNow<(Memory::CollectionFlags)134217728>(this);
          this_local._7_1_ = true;
        }
      }
      else if ((this->recyclerPartialStress & 1U) == 0) {
        CollectNow<(Memory::CollectionFlags)268439552>(this);
        this_local._7_1_ = true;
      }
      else {
        CollectNow<(Memory::CollectionFlags)402657280>(this);
        this_local._7_1_ = true;
      }
    }
    else {
      CollectNow<(Memory::CollectionFlags)4096>(this);
      this_local._7_1_ = true;
    }
  }
  else {
    CollectNow<(Memory::CollectionFlags)16384>(this);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Recycler::StressCollectNow()
{
    if (this->recyclerStress)
    {
        this->CollectNow<CollectStress>();
        return true;
    }
#if ENABLE_CONCURRENT_GC
    else if (this->recyclerBackgroundStress)
    {
        this->CollectNow<CollectBackgroundStress>();
        return true;
    }
    else if ((this->enableConcurrentMark || this->enableConcurrentSweep)
        && (this->recyclerConcurrentStress
        || this->recyclerConcurrentRepeatStress))
    {
#if ENABLE_PARTIAL_GC
        if (this->recyclerPartialStress)
        {
            this->CollectNow<CollectConcurrentPartialStress>();
            return true;
        }
        else
#endif // ENABLE_PARTIAL_GC
        {
            this->CollectNow<CollectConcurrentStress>();
            return true;
        }
    }
#endif // ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
    else if (this->recyclerPartialStress)
    {
        this->CollectNow<CollectPartialStress>();
        return true;
    }
#endif // ENABLE_PARTIAL_GC
    return false;
}